

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Literal * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::truncSFloat
          (Literal *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,Unary *curr,
          Literal *value)

{
  bool bVar1;
  uint uVar2;
  int32_t iVar3;
  int64_t iVar4;
  BasicType local_3c [3];
  double local_30;
  double val;
  Literal *value_local;
  Unary *curr_local;
  ExpressionRunner<wasm::ModuleRunner> *this_local;
  
  val = (double)value;
  value_local = (Literal *)curr;
  curr_local = (Unary *)this;
  this_local = (ExpressionRunner<wasm::ModuleRunner> *)__return_storage_ptr__;
  local_30 = wasm::Literal::getFloat(value);
  uVar2 = std::isnan(local_30);
  if ((uVar2 & 1) != 0) {
    (*this->_vptr_ExpressionRunner[2])(this,"truncSFloat of nan");
  }
  local_3c[2] = 2;
  bVar1 = wasm::Type::operator==
                    ((Type *)&(value_local->field_0).func.super_IString.str._M_str,local_3c + 2);
  if (bVar1) {
    local_3c[1] = 4;
    bVar1 = wasm::Type::operator==(&value->type,local_3c + 1);
    if (bVar1) {
      iVar3 = wasm::Literal::reinterpreti32(value);
      bVar1 = isInRangeI32TruncS(iVar3);
      if (!bVar1) {
        (*this->_vptr_ExpressionRunner[2])(this,"i32.truncSFloat overflow");
      }
    }
    else {
      iVar4 = wasm::Literal::reinterpreti64(value);
      bVar1 = isInRangeI32TruncS(iVar4);
      if (!bVar1) {
        (*this->_vptr_ExpressionRunner[2])(this,"i32.truncSFloat overflow");
      }
    }
    wasm::Literal::Literal(__return_storage_ptr__,(int)local_30);
  }
  else {
    local_3c[0] = f32;
    bVar1 = wasm::Type::operator==(&value->type,local_3c);
    if (bVar1) {
      iVar3 = wasm::Literal::reinterpreti32(value);
      bVar1 = isInRangeI64TruncS(iVar3);
      if (!bVar1) {
        (*this->_vptr_ExpressionRunner[2])(this,"i64.truncSFloat overflow");
      }
    }
    else {
      iVar4 = wasm::Literal::reinterpreti64(value);
      bVar1 = isInRangeI64TruncS(iVar4);
      if (!bVar1) {
        (*this->_vptr_ExpressionRunner[2])(this,"i64.truncSFloat overflow");
      }
    }
    wasm::Literal::Literal(__return_storage_ptr__,(long)local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

Literal truncSFloat(Unary* curr, Literal value) {
    double val = value.getFloat();
    if (std::isnan(val)) {
      trap("truncSFloat of nan");
    }
    if (curr->type == Type::i32) {
      if (value.type == Type::f32) {
        if (!isInRangeI32TruncS(value.reinterpreti32())) {
          trap("i32.truncSFloat overflow");
        }
      } else {
        if (!isInRangeI32TruncS(value.reinterpreti64())) {
          trap("i32.truncSFloat overflow");
        }
      }
      return Literal(int32_t(val));
    } else {
      if (value.type == Type::f32) {
        if (!isInRangeI64TruncS(value.reinterpreti32())) {
          trap("i64.truncSFloat overflow");
        }
      } else {
        if (!isInRangeI64TruncS(value.reinterpreti64())) {
          trap("i64.truncSFloat overflow");
        }
      }
      return Literal(int64_t(val));
    }
  }